

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O1

void duckdb_je_tsd_state_set(tsd_t *tsd,uint8_t new_state)

{
  tsd_t *ptVar1;
  tsd_t *ptVar2;
  int iVar3;
  
  if ((tsd->state).repr < 3) {
    if (new_state < 3) {
      duckdb_je_tsd_slow_update(tsd);
    }
    else {
      iVar3 = pthread_mutex_trylock
                        ((pthread_mutex_t *)((long)&tsd_nominal_tsds_lock.field_0 + 0x48));
      if (iVar3 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&tsd_nominal_tsds_lock);
      }
      tsd_nominal_tsds_lock.field_0.field_0.prof_data.n_lock_ops =
           tsd_nominal_tsds_lock.field_0.field_0.prof_data.n_lock_ops + 1;
      if (&(tsd_nominal_tsds_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        tsd_nominal_tsds_lock.field_0.witness.link.qre_prev =
             (witness_t *)(tsd_nominal_tsds_lock.field_0.field_0.prof_data.n_owner_switches + 1);
        tsd_nominal_tsds_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
      }
      if (tsd_nominal_tsds.qlh_first == tsd) {
        tsd_nominal_tsds.qlh_first =
             ((tsd_nominal_tsds.qlh_first)->
             cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next;
      }
      if (tsd_nominal_tsds.qlh_first == tsd) {
        tsd_nominal_tsds.qlh_first = (tsd_t *)0x0;
      }
      else {
        ptVar1 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_prev;
        (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next =
             (((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next)->
             cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_prev;
        ptVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next;
        (ptVar2->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_prev = ptVar1;
        ptVar1 = (((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_prev)->
                 cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_prev = ptVar1;
        (((ptVar2->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_prev)->
        cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next = ptVar2;
        (ptVar1->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).qre_next = tsd;
      }
      tsd_nominal_tsds_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&tsd_nominal_tsds_lock.field_0 + 0x48));
      (tsd->state).repr = new_state;
    }
  }
  else {
    (tsd->state).repr = new_state;
    if (new_state < 3) {
      tsd_add_nominal(tsd);
    }
  }
  duckdb_je_te_recompute_fast_threshold(tsd);
  return;
}

Assistant:

void
tsd_state_set(tsd_t *tsd, uint8_t new_state) {
	/* Only the tsd module can change the state *to* recompute. */
	assert(new_state != tsd_state_nominal_recompute);
	uint8_t old_state = tsd_atomic_load(&tsd->state, ATOMIC_RELAXED);
	if (old_state > tsd_state_nominal_max) {
		/*
		 * Not currently in the nominal list, but it might need to be
		 * inserted there.
		 */
		assert(!tsd_in_nominal_list(tsd));
		tsd_atomic_store(&tsd->state, new_state, ATOMIC_RELAXED);
		if (new_state <= tsd_state_nominal_max) {
			tsd_add_nominal(tsd);
		}
	} else {
		/*
		 * We're currently nominal.  If the new state is non-nominal,
		 * great; we take ourselves off the list and just enter the new
		 * state.
		 */
		assert(tsd_in_nominal_list(tsd));
		if (new_state > tsd_state_nominal_max) {
			tsd_remove_nominal(tsd);
			tsd_atomic_store(&tsd->state, new_state,
			    ATOMIC_RELAXED);
		} else {
			/*
			 * This is the tricky case.  We're transitioning from
			 * one nominal state to another.  The caller can't know
			 * about any races that are occurring at the same time,
			 * so we always have to recompute no matter what.
			 */
			tsd_slow_update(tsd);
		}
	}
	te_recompute_fast_threshold(tsd);
}